

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int ar_parse_common_header(ar *ar,archive_entry *entry,char *h)

{
  uint64_t uVar1;
  long in_RDX;
  archive_entry *in_RSI;
  uint64_t *in_RDI;
  uint64_t n;
  
  uVar1 = ar_atol10((char *)(in_RDX + 0x10),0xc);
  archive_entry_set_mtime(in_RSI,uVar1,0);
  uVar1 = ar_atol10((char *)(in_RDX + 0x1c),6);
  archive_entry_set_uid(in_RSI,uVar1 & 0xffffffff);
  uVar1 = ar_atol10((char *)(in_RDX + 0x22),6);
  archive_entry_set_gid(in_RSI,uVar1 & 0xffffffff);
  uVar1 = ar_atol8((char *)(in_RDX + 0x28),8);
  archive_entry_set_mode(in_RSI,(mode_t)uVar1);
  uVar1 = ar_atol10((char *)(in_RDX + 0x30),10);
  in_RDI[2] = 0;
  in_RDI[3] = uVar1 & 1;
  archive_entry_set_size(in_RSI,uVar1);
  *in_RDI = uVar1;
  return 0;
}

Assistant:

static int
ar_parse_common_header(struct ar *ar, struct archive_entry *entry,
    const char *h)
{
	uint64_t n;

	/* Copy remaining header */
	archive_entry_set_mtime(entry,
	    (time_t)ar_atol10(h + AR_date_offset, AR_date_size), 0L);
	archive_entry_set_uid(entry,
	    (uid_t)ar_atol10(h + AR_uid_offset, AR_uid_size));
	archive_entry_set_gid(entry,
	    (gid_t)ar_atol10(h + AR_gid_offset, AR_gid_size));
	archive_entry_set_mode(entry,
	    (mode_t)ar_atol8(h + AR_mode_offset, AR_mode_size));
	n = ar_atol10(h + AR_size_offset, AR_size_size);

	ar->entry_offset = 0;
	ar->entry_padding = n % 2;
	archive_entry_set_size(entry, n);
	ar->entry_bytes_remaining = n;
	return (ARCHIVE_OK);
}